

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O1

int maph(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  long *plVar7;
  size_type *psVar8;
  ulong uVar9;
  long lVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> img;
  vector<unsigned_int,_std::allocator<unsigned_int>_> idx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  vector<unsigned_int,_std::allocator<unsigned_int>_> kernel;
  json inj;
  string fjson;
  Transformation t;
  Data d;
  Settings s;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_508;
  long lStack_4f0;
  int local_4e4;
  string local_4e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4a8;
  string local_490;
  ulong local_470;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_468;
  string local_450;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_430;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_418;
  string local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  Transformation local_3a8;
  Data local_350;
  Settings local_2b8;
  
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 0x10;
  Settings::Settings(&local_2b8);
  paVar1 = &local_3a8.outdir.field_2;
  local_3a8.mat.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3a8.mat.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3a8.mat.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3a8.outdir._M_string_length = 0;
  local_3a8.outdir.field_2._M_local_buf[0] = '\0';
  local_3a8.outdir._M_dataplus._M_p = (pointer)paVar1;
  memset(&local_350,0,0x90);
  local_408._M_string_length = 0;
  local_408.field_2._M_local_buf[0] = '\0';
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  iVar3 = loadArgs(argc,argv,&local_2b8,&local_3a8,&local_408);
  if (iVar3 == 0) {
    local_418.m_type = null;
    local_418.m_value.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_418,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_418,true);
    iVar3 = loadJson(&local_408,&local_418);
    if (iVar3 == 0) {
      iVar3 = loadSettings(&local_2b8,&local_418,&local_408);
      if (iVar3 == 0) {
        getFiles(&local_2b8.fgpx,&local_350.gpxs);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Number of GPX files = ",0x16);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        setTransformation(&local_3a8);
        iVar4 = loadGpxs(&local_2b8,&local_3a8,&local_350);
        iVar3 = 1;
        if ((iVar4 == 0) && (iVar3 = 0, local_3a8.enable == false)) {
          setFitting(&local_2b8,&local_350);
          getKernel(&local_430,&local_2b8);
          convolute(&local_4c0,&local_2b8,&local_350,&local_430);
          irwincolor::sortidx<unsigned_int>(&local_4a8,&local_4c0);
          if (local_2b8.allCmaps == true) {
            if (local_2b8.mapNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_2b8.mapNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              iVar3 = 0;
            }
            else {
              lVar10 = 8;
              uVar9 = 0;
              do {
                local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                local_470 = uVar9;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_490,local_2b8.cmapFile._M_dataplus._M_p,
                           local_2b8.cmapFile._M_dataplus._M_p + local_2b8.cmapFile._M_string_length
                          );
                lVar2 = *(long *)((long)local_2b8.mapNames.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar10 + -8);
                local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_450,lVar2,
                           *(long *)((long)&((local_2b8.mapNames.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar10) + lVar2);
                iVar4 = irwincolor::Map::load(&local_2b8.c,&local_490,&local_450);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_450._M_dataplus._M_p != &local_450.field_2) {
                  operator_delete(local_450._M_dataplus._M_p,
                                  local_450.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_490._M_dataplus._M_p != &local_490.field_2) {
                  operator_delete(local_490._M_dataplus._M_p,
                                  local_490.field_2._M_allocated_capacity + 1);
                }
                iVar3 = 1;
                if (iVar4 != 0) goto LAB_0010f6d6;
                colorPixels(&local_468,&local_2b8,&local_4c0,&local_4a8);
                iVar4 = local_2b8.ny;
                local_4e4 = local_2b8.nx;
                std::operator+(&local_3e8,&local_2b8.fname,&local_2b8.dlm);
                plVar6 = (long *)std::__cxx11::string::_M_append
                                           ((char *)&local_3e8,
                                            *(ulong *)((long)local_2b8.mapNames.
                                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  lVar10 + -8));
                local_508.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)&local_508.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
                plVar7 = plVar6 + 2;
                if ((pointer *)*plVar6 == (pointer *)plVar7) {
                  local_508.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar7;
                  lStack_4f0 = plVar6[3];
                }
                else {
                  local_508.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar7;
                  local_508.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar6;
                }
                local_508.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)plVar6[1];
                *plVar6 = (long)plVar7;
                plVar6[1] = 0;
                *(undefined1 *)(plVar6 + 2) = 0;
                plVar6 = (long *)std::__cxx11::string::_M_append
                                           ((char *)&local_508,
                                            (ulong)local_2b8.imgext._M_dataplus._M_p);
                local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
                psVar8 = (size_type *)(plVar6 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar6 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar8) {
                  local_4e0.field_2._M_allocated_capacity = *psVar8;
                  local_4e0.field_2._8_8_ = plVar6[3];
                }
                else {
                  local_4e0.field_2._M_allocated_capacity = *psVar8;
                  local_4e0._M_dataplus._M_p = (pointer)*plVar6;
                }
                local_4e0._M_string_length = plVar6[1];
                *plVar6 = (long)psVar8;
                plVar6[1] = 0;
                *(undefined1 *)(plVar6 + 2) = 0;
                iVar4 = irwincolor::savePng(&local_468,local_4e4,iVar4,&local_4e0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
                  operator_delete(local_4e0._M_dataplus._M_p,
                                  local_4e0.field_2._M_allocated_capacity + 1);
                }
                if ((pointer *)
                    local_508.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start !=
                    &local_508.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  operator_delete(local_508.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (ulong)(local_508.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                  operator_delete(local_3e8._M_dataplus._M_p,
                                  local_3e8.field_2._M_allocated_capacity + 1);
                }
                if (local_468.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_468.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_468.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_468.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (iVar4 != 0) goto LAB_0010f6d6;
                uVar9 = local_470 + 1;
                lVar10 = lVar10 + 0x20;
              } while (uVar9 < (ulong)((long)local_2b8.mapNames.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_2b8.mapNames.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 5));
              iVar3 = 0;
            }
          }
          else {
            colorPixels(&local_508,&local_2b8,&local_4c0,&local_4a8);
            std::operator+(&local_3c8,&local_2b8.fname,&local_2b8.imgext);
            iVar3 = irwincolor::savePng(&local_508,local_2b8.nx,local_2b8.ny,&local_3c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
              operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((pointer *)
                local_508.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer *)0x0) {
              operator_delete(local_508.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_508.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_508.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
LAB_0010f6d6:
          if (local_4a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_4a8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_4a8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_4a8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_4c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_4c0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_4c0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_4c0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_430.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_430.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_430.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_430.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_418);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,
                    CONCAT71(local_408.field_2._M_allocated_capacity._1_7_,
                             local_408.field_2._M_local_buf[0]) + 1);
  }
  Data::~Data(&local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8.outdir._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8.outdir._M_dataplus._M_p,
                    CONCAT71(local_3a8.outdir.field_2._M_allocated_capacity._1_7_,
                             local_3a8.outdir.field_2._M_local_buf[0]) + 1);
  }
  if (local_3a8.mat.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3a8.mat.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3a8.mat.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3a8.mat.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Settings::~Settings(&local_2b8);
  return iVar3;
}

Assistant:

int maph(int argc, char* argv[])
{
	int io = 0;

	std::cout << std::setprecision(16);

	Settings s;
	Transformation t;
	Data d;
	std::string fjson;

	io = loadArgs(argc, argv, s, t, fjson);
	if (io != 0)
		return io;

	json inj;
	io = loadJson(fjson, inj);
	if (io != 0)
		return io;

	io = loadSettings(s, inj, fjson);
	if (io != 0)
		return io;

	getFiles(s.fgpx, d.gpxs);

	//std::cout << "GPX files = " << d.gpxs << std::endl;
	std::cout << "Number of GPX files = " << d.gpxs.size() << std::endl;

	setTransformation(t);

	io = loadGpxs(s, t, d);
	if (io != 0)
		return io;

	if (t.enable)
		return 0;

	setFitting(s, d);
	auto kernel = getKernel(s);
	auto img = convolute(s, d, kernel);
	//return 0;  // for benchmarking kernel convolution

	// Sort for histogram coloring.
	auto idx = irwincolor::sortidx(img);

	if (s.allCmaps)
	{
		for (int i = 0; i < s.mapNames.size(); i++)
		{
			if (io = s.c.load(s.cmapFile, s.mapNames[i]) != 0)
				return io;
			auto pixels = colorPixels(s, img, idx);
			if (io = irwincolor::savePng(pixels, s.nx, s.ny,
					s.fname + s.dlm + s.mapNames[i] + s.imgext)
					!= 0)
				return io;
		}
	}
	else
	{
		auto pixels = colorPixels(s, img, idx);
		io = irwincolor::savePng(pixels, s.nx, s.ny, s.fname + s.imgext);
	}

	return io;
}